

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O1

string * __thiscall
cfd::core::KeyData::GetBip32Path_abi_cxx11_
          (string *__return_storage_ptr__,KeyData *this,HardenedType hardened_type,bool has_hex)

{
  uint uVar1;
  pointer puVar2;
  bool bVar3;
  pointer puVar4;
  char *pcVar5;
  stringstream ss;
  stringstream local_1b8 [16];
  long local_1a8 [3];
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  puVar4 = (this->path_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (this->path_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar4 != puVar2) {
    bVar3 = true;
    do {
      uVar1 = *puVar4;
      if (!bVar3) {
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"/",1);
      }
      if (has_hex) {
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"0x",2);
        *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
             *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
      }
      ::std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      if ((int)uVar1 < 0) {
        pcVar5 = "H";
        if (hardened_type != kLargeH) {
          if (hardened_type == kNumber) goto LAB_00443601;
          if (hardened_type == kSmallH) {
            pcVar5 = "h";
          }
          else {
            pcVar5 = "\'";
          }
        }
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar5,1);
      }
LAB_00443601:
      puVar4 = puVar4 + 1;
      bVar3 = false;
    } while (puVar4 != puVar2);
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string KeyData::GetBip32Path(
    HardenedType hardened_type, bool has_hex) const {
  std::stringstream ss;
  bool is_first = true;
  for (auto child_num : path_) {
    if (!is_first) ss << "/";
    uint32_t num = (hardened_type == HardenedType::kNumber)
                       ? child_num
                       : (child_num & 0x7FFFFFFF);
    if (has_hex) {
      ss << "0x" << std::hex << num;
    } else {
      ss << num;
    }

    if (child_num & 0x80000000) {
      switch (hardened_type) {
        case kLargeH:
          ss << "H";
          break;
        case kSmallH:
          ss << "h";
          break;
        case kNumber:
          // do nothing
          break;
        case kApostrophe:
        default:
          ss << "'";
          break;
      }
    }
    is_first = false;
  }
  return ss.str();
}